

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O2

void ParseFriction(FScanner *sc,int keyword,void *fields)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  FScanner::MustGetFloat(sc);
  dVar1 = sc->Float * 100.0 * 7864.0 * 0.0078125 + 53249.0;
  dVar2 = 65536.0;
  if (dVar1 <= 65536.0) {
    dVar2 = dVar1;
  }
  dVar2 = (double)(-(ulong)(0.0 < dVar1) & (ulong)dVar2);
  if (dVar2 <= 59392.0) {
    dVar1 = (dVar2 + -56116.0) * 10.0 * 0.0078125;
  }
  else {
    dVar1 = ((65682.0 - dVar2) * 1024.0) / 4352.0 + 568.0;
  }
  dVar3 = 32.0;
  if (32.0 <= dVar1) {
    dVar3 = dVar1;
  }
  *(double *)((long)fields + 0x38) = dVar2 * 1.52587890625e-05;
  *(double *)((long)fields + 0x40) = dVar3 * 1.52587890625e-05;
  return;
}

Assistant:

static void ParseFriction (FScanner &sc, int keyword, void *fields)
{
	FTerrainDef *def = (FTerrainDef *)fields;
	double friction, movefactor;

	sc.MustGetFloat ();

	// These calculations should match those in P_SetSectorFriction().
	// A friction of 1.0 is equivalent to ORIG_FRICTION.

	friction = (0x1EB8*(sc.Float*100))/0x80 + 0xD001;
	friction = clamp<double> (friction, 0, 65536.);

	if (friction > ORIG_FRICTION * 65536.)	// ice
		movefactor = ((0x10092 - friction) * 1024) / 4352 + 568;
	else
		movefactor = ((friction - 0xDB34)*(0xA))/0x80;

	if (movefactor < 32)
		movefactor = 32;

	def->Friction = friction / 65536.;
	def->MoveFactor = movefactor / 65536.;
}